

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d_utils.h
# Opt level: O0

Array2D<double> *
TNT::operator+(Array2D<double> *__return_storage_ptr__,Array2D<double> *A,Array2D<double> *B)

{
  double dVar1;
  double dVar2;
  int m_00;
  int n_00;
  int iVar3;
  double *pdVar4;
  int local_34;
  int local_30;
  int j;
  int i;
  int n;
  int m;
  Array2D<double> *B_local;
  Array2D<double> *A_local;
  Array2D<double> *C;
  
  m_00 = Array2D<double>::dim1(A);
  n_00 = Array2D<double>::dim2(A);
  iVar3 = Array2D<double>::dim1(B);
  if ((iVar3 == m_00) && (iVar3 = Array2D<double>::dim2(B), iVar3 == n_00)) {
    Array2D<double>::Array2D(__return_storage_ptr__,m_00,n_00);
    for (local_30 = 0; local_30 < m_00; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < n_00; local_34 = local_34 + 1) {
        pdVar4 = Array2D<double>::operator[](A,local_30);
        dVar1 = pdVar4[local_34];
        pdVar4 = Array2D<double>::operator[](B,local_30);
        dVar2 = pdVar4[local_34];
        pdVar4 = Array2D<double>::operator[](__return_storage_ptr__,local_30);
        pdVar4[local_34] = dVar1 + dVar2;
      }
    }
  }
  else {
    Array2D<double>::Array2D(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> operator+(const Array2D<T> &A, const Array2D<T> &B)
{
	int m = A.dim1();
	int n = A.dim2();

	if (B.dim1() != m ||  B.dim2() != n )
		return Array2D<T>();

	else
	{
		Array2D<T> C(m,n);

		for (int i=0; i<m; i++)
		{
			for (int j=0; j<n; j++)
				C[i][j] = A[i][j] + B[i][j];
		}
		return C;
	}
}